

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

void __thiscall
Centaurus::CATNDepartureSetFactory<wchar_t>::closure_add
          (CATNDepartureSetFactory<wchar_t> *this,CATNClosure *closure,
          CATNDeparture<wchar_t> *departure)

{
  bool bVar1;
  pointer pCVar2;
  PriorityChain *pPVar3;
  ATNPath *__args;
  PriorityChain *pPVar4;
  int local_64;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Self local_48;
  _Self local_40;
  iterator i_1;
  _Self local_30;
  _Self local_28;
  iterator i;
  CATNDeparture<wchar_t> *departure_local;
  CATNClosure *closure_local;
  CATNDepartureSetFactory<wchar_t> *this_local;
  
  i._M_node = (_Base_ptr)departure;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
       ::cbegin(closure);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
         ::cend(closure);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      local_40._M_node =
           (_Base_ptr)
           std::
           set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           ::begin(closure);
      while( true ) {
        local_48._M_node =
             (_Base_ptr)
             std::
             set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
             ::end(closure);
        bVar1 = std::operator!=(&local_40,&local_48);
        if (!bVar1) break;
        pPVar4 = CATNDeparture<wchar_t>::priority((CATNDeparture<wchar_t> *)i._M_node);
        pCVar2 = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator->(&local_40);
        pPVar3 = CATNClosureElement::priority(pCVar2);
        bVar1 = PriorityChain::is_superior_to(pPVar4,pPVar3);
        if (bVar1) {
          local_58 = local_40._M_node;
          local_50 = (_Base_ptr)
                     std::
                     set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                     ::erase_abi_cxx11_((set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                                         *)closure,local_40._M_node);
          local_40._M_node = local_50;
        }
        else {
          local_60 = (_Base_ptr)
                     std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++
                               (&local_40,0);
        }
      }
      __args = CATNDeparture<wchar_t>::path((CATNDeparture<wchar_t> *)i._M_node);
      local_64 = CATNDeparture<wchar_t>::color((CATNDeparture<wchar_t> *)i._M_node);
      pPVar4 = CATNDeparture<wchar_t>::priority((CATNDeparture<wchar_t> *)i._M_node);
      std::
      set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
      ::emplace<Centaurus::ATNPath_const&,int,Centaurus::PriorityChain_const&>
                ((set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>
                  *)closure,__args,&local_64,pPVar4);
      return;
    }
    pPVar4 = CATNDeparture<wchar_t>::priority((CATNDeparture<wchar_t> *)i._M_node);
    pCVar2 = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator->(&local_28);
    pPVar3 = CATNClosureElement::priority(pCVar2);
    bVar1 = PriorityChain::is_inferior_to(pPVar4,pPVar3);
    if (bVar1) break;
    i_1._M_node = (_Base_ptr)
                  std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++
                            (&local_28,0);
  }
  return;
}

Assistant:

void closure_add(CATNClosure& closure, const CATNDeparture<TCHAR>& departure) const
    {
        for (auto i = closure.cbegin(); i != closure.cend(); i++)
        {
            if (departure.priority().is_inferior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << departure.label() << L":" << departure.priority() << L" by " << i->label() << L":" << i->priority() << std::endl;
                return;
            }
        }
        for (auto i = closure.begin(); i != closure.end();)
        {
            if (departure.priority().is_superior_to(i->priority()))
            {
                //std::wcerr << L"Departure " << i->label() << L":" << i->priority() << L" expelled by " << departure.label() << L":" << departure.priority() << std::endl;
                i = closure.erase(i);
            }
            else
            {
                i++;
            }
        }
        closure.emplace(departure.path(), departure.color(), departure.priority());
    }